

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_test_util.cc
# Opt level: O3

void ctemplate::AssertExpandWithCacheIs
               (TemplateCache *cache,string *filename,Strip strip,TemplateDictionary *dict,
               PerExpandData *per_expand_data,string *is,bool expected)

{
  char *__s2;
  undefined1 *puVar1;
  int iVar2;
  char *__s1;
  bool bVar3;
  allocator local_41;
  undefined1 *local_40;
  size_t local_38;
  undefined1 local_30 [16];
  
  __s1 = ExpandWithCacheIs(cache,filename,strip,dict,per_expand_data,expected);
  __s2 = (is->_M_dataplus)._M_p;
  iVar2 = strcmp(__s1,__s2);
  if (iVar2 != 0) {
    printf("expected = \'%s\'\n",__s2);
    printf("actual   = \'%s\'\n",__s1);
  }
  std::__cxx11::string::string((string *)&local_40,__s1,&local_41);
  puVar1 = local_40;
  if (local_38 == is->_M_string_length) {
    if (local_38 == 0) {
      bVar3 = true;
    }
    else {
      iVar2 = bcmp(local_40,(is->_M_dataplus)._M_p,local_38);
      bVar3 = iVar2 == 0;
    }
  }
  else {
    bVar3 = false;
  }
  if (puVar1 != local_30) {
    operator_delete(puVar1);
  }
  if (bVar3) {
    operator_delete__(__s1);
    return;
  }
  printf("ASSERT FAILED, line %d: %s\n",0xdf,"string(buf) == is");
  std::__cxx11::string::string((string *)&local_40,__s1,&local_41);
  if (local_38 == is->_M_string_length) {
    if (local_38 != 0) {
      iVar2 = bcmp(local_40,(is->_M_dataplus)._M_p,local_38);
      if (iVar2 != 0) goto LAB_00106713;
    }
    std::__cxx11::string::~string((string *)&local_40);
    exit(1);
  }
LAB_00106713:
  __assert_fail("string(buf) == is",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_test_util.cc"
                ,0xdf,
                "void ctemplate::AssertExpandWithCacheIs(TemplateCache *, const string &, Strip, const TemplateDictionary *, PerExpandData *, const string &, bool)"
               );
}

Assistant:

void AssertExpandWithCacheIs(TemplateCache* cache,
                             const string& filename, Strip strip,
                             const TemplateDictionary *dict,
                             PerExpandData* per_expand_data,
                             const string& is, bool expected) {
  const char* buf = ExpandWithCacheIs(cache, filename, strip, dict,
                                      per_expand_data, expected);
  if (strcmp(buf, is.c_str())) {
    printf("expected = '%s'\n", is.c_str());
    printf("actual   = '%s'\n", buf);
  }
  ASSERT(string(buf) == is);
  delete [] buf;
}